

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O2

int select_key_share(ptls_key_exchange_algorithm_t **selected,ptls_iovec_t *peer_key,
                    ptls_key_exchange_algorithm_t **candidates,uint8_t **src,uint8_t *end,
                    int expect_one)

{
  ptls_key_exchange_algorithm_t *ppVar1;
  int iVar2;
  ptls_key_exchange_algorithm_t **pppVar3;
  uint16_t group;
  ptls_iovec_t key;
  
  *selected = (ptls_key_exchange_algorithm_t *)0x0;
  if ((expect_one == 0) || (*src != end)) {
    do {
      if (*src == end) {
        return 0;
      }
      iVar2 = decode_key_share_entry(&group,&key,src,end);
      pppVar3 = candidates;
      if (iVar2 != 0) {
        return iVar2;
      }
      for (; ppVar1 = *pppVar3, ppVar1 != (ptls_key_exchange_algorithm_t *)0x0;
          pppVar3 = pppVar3 + 1) {
        if ((*selected == (ptls_key_exchange_algorithm_t *)0x0) && (ppVar1->id == group)) {
          *selected = ppVar1;
          peer_key->base = key.base;
          peer_key->len = key.len;
        }
      }
    } while (expect_one == 0);
    iVar2 = 0x2f;
    if (*selected != (ptls_key_exchange_algorithm_t *)0x0) {
      iVar2 = 0;
    }
  }
  else {
    iVar2 = 0x2f;
  }
  return iVar2;
}

Assistant:

static int select_key_share(ptls_key_exchange_algorithm_t **selected, ptls_iovec_t *peer_key,
                            ptls_key_exchange_algorithm_t **candidates, const uint8_t **src, const uint8_t *const end,
                            int expect_one)
{
    int ret;

    *selected = NULL;

    if (expect_one && *src == end) {
        ret = PTLS_ALERT_ILLEGAL_PARAMETER;
        goto Exit;
    }

    while (*src != end) {
        uint16_t group;
        ptls_iovec_t key;
        if ((ret = decode_key_share_entry(&group, &key, src, end)) != 0)
            goto Exit;
        ptls_key_exchange_algorithm_t **c = candidates;
        for (; *c != NULL; ++c) {
            if (*selected == NULL && (*c)->id == group) {
                *selected = *c;
                *peer_key = key;
            }
        }
        if (expect_one) {
            ret = *selected != NULL ? 0 : PTLS_ALERT_ILLEGAL_PARAMETER;
            goto Exit;
        }
    }

    ret = 0;

Exit:
    return ret;
}